

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_zeroing<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  node_ptr plVar3;
  node_ptr plVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  pointer p;
  _Hash_node_base *p_Var13;
  ulong uVar14;
  pointer p_1;
  pointer p_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_> m;
  shared_count sStack_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined **local_2c0;
  undefined1 local_2b8;
  undefined8 *local_2b0;
  char **local_2a8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_2a0;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 local_168 [240];
  __buckets_ptr local_78;
  ulong local_70;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ();
  local_168._0_8_ = operator_new(0x38);
  (((Column_settings *)local_168._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((Column_settings *)local_168._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (((Column_settings *)local_168._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (((Column_settings *)local_168._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  (((Column_settings *)local_168._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (((Column_settings *)local_168._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (((Column_settings *)local_168._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
  ::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
              *)(local_168 + 8),&local_2a0,(Column_settings *)local_168._0_8_);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x26d);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_70;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar5,0);
  if (local_78[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_78[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var13 = p_Var2 + 5;
        goto LAB_0012f3ad;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var13 == (_Hash_node_base *)0x0) goto LAB_0012fb19;
    if (*(int *)&p_Var13[2]._M_nxt == 1) break;
LAB_0012f3ad:
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 5) break;
  }
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2d0 = "!m.is_zero_entry(3, 1)";
  local_2c8 = "";
  local_2b8 = 0;
  local_2c0 = &PTR__lazy_ostream_001f2250;
  local_2b0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_2a8 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x26e);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_70;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_78[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_78[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_2d8.pi_ = (sp_counted_base *)0x0;
        local_2d0 = "!m.is_zero_column(3)";
        local_2c8 = "";
        local_2b8 = 0;
        local_2c0 = &PTR__lazy_ostream_001f2250;
        local_2b0 = &boost::unit_test::lazy_ostream::inst;
        local_1c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_1c0 = "";
        local_2a8 = &local_2d0;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2d8);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_70;
        uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
        if (local_78[uVar14 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0012fb0d;
        p_Var2 = local_78[uVar14 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x0012f59c;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_00 == (pointer)0x0) goto LAB_0012fb19;
    if (p_00->rowIndex_ == 1) break;
LAB_0012f5ca:
    p_00 = (pointer)(p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p_00 == (pointer)(p_Var2 + 5)) goto LAB_0012f5fe;
  }
  plVar3 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar4 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar4->next_ = plVar3;
  plVar3->prev_ = plVar4;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>
  ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>
             *)p_Var2[4]._M_nxt,p_00);
LAB_0012f5fe:
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x270);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_70;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
  if (local_78[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_78[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var13 = p_Var2 + 5;
        goto LAB_0012f68e;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var13 == (_Hash_node_base *)0x0) goto LAB_0012fb19;
    if (*(int *)&p_Var13[2]._M_nxt == 1) break;
LAB_0012f68e:
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 5) break;
  }
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2d0 = "m.is_zero_entry(3, 1)";
  local_2c8 = "";
  local_2b8 = 0;
  local_2c0 = &PTR__lazy_ostream_001f2250;
  local_2b0 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_2a8 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x271);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_70;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
  if (local_78[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_78[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_2d8.pi_ = (sp_counted_base *)0x0;
        local_2d0 = "!m.is_zero_column(3)";
        local_2c8 = "";
        local_2b8 = 0;
        local_2c0 = &PTR__lazy_ostream_001f2250;
        local_2b0 = &boost::unit_test::lazy_ostream::inst;
        local_228 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_220 = "";
        local_2a8 = &local_2d0;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2d8);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_70;
        uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar10,0);
        if (local_78[uVar14 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0012fb0d;
        p_Var2 = local_78[uVar14 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x0012f879;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 == uVar14))) {
joined_r0x0012f59c:
    if (uVar1 == 3) {
      p_00 = (pointer)(p_Var2 + 5);
      goto LAB_0012f5ca;
    }
  }
LAB_0012fb0d:
  std::__throw_out_of_range("_Map_base::at");
joined_r0x0012f879:
  if (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 != uVar14)) goto LAB_0012fb0d;
    goto joined_r0x0012f879;
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)(p_Var2 + 5),
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
              *)(p_Var2 + 2));
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x273);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_70;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
  if (local_78[uVar14 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0012fb68;
  p_Var2 = local_78[uVar14 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
  while (uVar1 != 3) {
    p_Var2 = p_Var2->_M_nxt;
    if ((p_Var2 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 != uVar14)) {
LAB_0012fb68:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  p_Var13 = p_Var2 + 5;
  do {
    p_Var13 = p_Var13->_M_nxt;
    if (p_Var13 == p_Var2 + 5) break;
    if (p_Var13 == (_Hash_node_base *)0x0) {
LAB_0012fb19:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (*(int *)&p_Var13[2]._M_nxt != 1);
  sStack_2d8.pi_ = (sp_counted_base *)0x0;
  local_2d0 = "m.is_zero_entry(3, 1)";
  local_2c8 = "";
  local_2b8 = 0;
  local_2c0 = &PTR__lazy_ostream_001f2250;
  local_2b0 = &boost::unit_test::lazy_ostream::inst;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_2a8 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2d8);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_268,0x274);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_70;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar12,0);
  if (local_78[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_78[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_2d8.pi_ = (sp_counted_base *)0x0;
        local_2d0 = "m.is_zero_column(3)";
        local_2c8 = "";
        local_2b8 = 0;
        local_2c0 = &PTR__lazy_ostream_001f2250;
        local_2b0 = &boost::unit_test::lazy_ostream::inst;
        local_288 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_280 = "";
        local_2a8 = &local_2d0;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_2d8);
        Gudhi::persistence_matrix::
        Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
        ::~Matrix((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>
                   *)local_168);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_2a0);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}